

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

void __thiscall icu_63::RuleBasedNumberFormat::initDefaultRuleSet(RuleBasedNumberFormat *this)

{
  UBool UVar1;
  NFRuleSet *pNVar2;
  NFRuleSet **ppNVar3;
  UnicodeString duration;
  UnicodeString ordinal;
  UnicodeString spellout;
  ConstChar16Ptr local_130;
  ConstChar16Ptr local_128;
  ConstChar16Ptr local_120;
  char16_t *local_118;
  char16_t *local_108;
  char16_t *local_f8;
  UnicodeString local_e8;
  UnicodeString local_a8;
  UnicodeString local_68;
  
  this->defaultRuleSet = (NFRuleSet *)0x0;
  if (this->fRuleSets != (NFRuleSet **)0x0) {
    local_120.p_ = L"%spellout-numbering";
    UnicodeString::UnicodeString(&local_68,'\x01',&local_120,-1);
    local_f8 = local_120.p_;
    local_128.p_ = L"%digits-ordinal";
    UnicodeString::UnicodeString(&local_a8,'\x01',&local_128,-1);
    local_108 = local_128.p_;
    local_130.p_ = L"%duration";
    UnicodeString::UnicodeString(&local_e8,'\x01',&local_130,-1);
    local_118 = local_130.p_;
    ppNVar3 = this->fRuleSets;
    pNVar2 = *ppNVar3;
    if (pNVar2 != (NFRuleSet *)0x0) {
      do {
        UVar1 = NFRuleSet::isNamed(pNVar2,&local_68);
        if (((UVar1 != '\0') || (UVar1 = NFRuleSet::isNamed(*ppNVar3,&local_a8), UVar1 != '\0')) ||
           (UVar1 = NFRuleSet::isNamed(*ppNVar3,&local_e8), UVar1 != '\0')) {
          pNVar2 = *ppNVar3;
          goto LAB_0021edb2;
        }
        pNVar2 = ppNVar3[1];
        ppNVar3 = ppNVar3 + 1;
      } while (pNVar2 != (NFRuleSet *)0x0);
    }
    pNVar2 = ppNVar3[-1];
    this->defaultRuleSet = pNVar2;
    if (pNVar2->fIsPublic == '\0') {
      do {
        if (ppNVar3 + -1 == this->fRuleSets) goto LAB_0021edb9;
        pNVar2 = ppNVar3[-2];
        ppNVar3 = ppNVar3 + -1;
      } while (pNVar2->fIsPublic == '\0');
LAB_0021edb2:
      this->defaultRuleSet = pNVar2;
    }
LAB_0021edb9:
    UnicodeString::~UnicodeString(&local_e8);
    UnicodeString::~UnicodeString(&local_a8);
    UnicodeString::~UnicodeString(&local_68);
  }
  return;
}

Assistant:

void 
RuleBasedNumberFormat::initDefaultRuleSet()
{
    defaultRuleSet = NULL;
    if (!fRuleSets) {
        return;
    }

    const UnicodeString spellout(UNICODE_STRING_SIMPLE("%spellout-numbering"));
    const UnicodeString ordinal(UNICODE_STRING_SIMPLE("%digits-ordinal"));
    const UnicodeString duration(UNICODE_STRING_SIMPLE("%duration"));

    NFRuleSet**p = &fRuleSets[0];
    while (*p) {
        if ((*p)->isNamed(spellout) || (*p)->isNamed(ordinal) || (*p)->isNamed(duration)) {
            defaultRuleSet = *p;
            return;
        } else {
            ++p;
        }
    }

    defaultRuleSet = *--p;
    if (!defaultRuleSet->isPublic()) {
        while (p != fRuleSets) {
            if ((*--p)->isPublic()) {
                defaultRuleSet = *p;
                break;
            }
        }
    }
}